

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O2

void convert(vector<const_char_*,_std::allocator<const_char_*>_> *in,
            vector<const_char_*,_std::allocator<const_char_*>_> views,char *outname,bool override)

{
  int iVar1;
  PixelType PVar2;
  pointer ppcVar3;
  char *pcVar4;
  sbyte sVar5;
  pointer pMVar6;
  pointer pFVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  Header *pHVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
  *this;
  string *psVar13;
  _Rb_tree_node_base *p_Var14;
  _Rb_tree_node_base *p_Var15;
  int *piVar16;
  long lVar17;
  invalid_argument *piVar18;
  undefined7 in_register_00000011;
  Header *this_00;
  size_type __n;
  long lVar19;
  string *psVar20;
  long lVar21;
  ulong uVar22;
  PixelType *pPVar23;
  size_t i;
  long lVar24;
  bool pforce;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
  output_channels;
  MultiPartOutputFile outfile;
  long alStack_1c0 [2];
  long *local_1b0;
  long *local_1a8;
  undefined8 local_1a0;
  vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
  input_channels;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  channelstore;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> output_headers;
  MultiPartInputFile infile;
  vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> output_framebuffers;
  InputPart inpart;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  char *local_c8;
  string *local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  ulong local_a0;
  ulong local_98;
  long local_90;
  int pnum;
  string hero;
  FrameBuffer input_framebuffer;
  
  local_c8 = (char *)CONCAT71(in_register_00000011,override);
  ppcVar3 = (in->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)(in->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)ppcVar3 != 8) {
    piVar18 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar18,"can only convert one file at once - use \'combine\' mode for multiple files"
              );
    __cxa_throw(piVar18,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pcVar4 = *ppcVar3;
  iVar10 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile(&infile,pcVar4,iVar10,true);
  iVar10 = Imf_3_4::MultiPartInputFile::parts();
  if (iVar10 == 1) {
    input_channels.
    super__Vector_base<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    input_channels.
    super__Vector_base<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    input_channels.
    super__Vector_base<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    hero._M_dataplus._M_p = (pointer)&hero.field_2;
    hero._M_string_length = 0;
    hero.field_2._M_local_buf[0] = '\0';
    pHVar12 = (Header *)Imf_3_4::MultiPartInputFile::header((int)&infile);
    cVar8 = Imf_3_4::hasMultiView(pHVar12);
    if (cVar8 != '\0') {
      pHVar12 = (Header *)Imf_3_4::MultiPartInputFile::header((int)&infile);
      __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)Imf_3_4::multiView_abi_cxx11_(pHVar12);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&outfile,__x);
      if ((pointer)alStack_1c0[0] != _outfile) {
        std::__cxx11::string::_M_assign((string *)&hero);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&outfile);
    }
    Imf_3_4::
    GetChannelsInMultiPartFile<std::vector<Imf_3_4::MultiViewChannelName,std::allocator<Imf_3_4::MultiViewChannelName>>>
              (&infile,&input_channels);
    std::vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>::
    vector(&output_channels,&input_channels);
    _outfile = output_channels.
               super__Vector_base<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
               ._M_impl.super__Vector_impl_data._M_start;
    input_framebuffer._map._M_t._M_impl._0_8_ =
         output_channels.
         super__Vector_base<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    uVar11 = Imf_3_4::
             SplitChannels<__gnu_cxx::__normal_iterator<Imf_3_4::MultiViewChannelName*,std::vector<Imf_3_4::MultiViewChannelName,std::allocator<Imf_3_4::MultiViewChannelName>>>>
                       ((__normal_iterator<Imf_3_4::MultiViewChannelName_*,_std::vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>_>
                         *)&outfile,
                        (__normal_iterator<Imf_3_4::MultiViewChannelName_*,_std::vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>_>
                         *)&input_framebuffer,true,&hero);
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
              (&output_headers,(long)(int)uVar11,(allocator_type *)&outfile);
    std::vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>::vector
              (&output_framebuffers,(long)(int)uVar11,(allocator_type *)&outfile);
    input_framebuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &input_framebuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    input_framebuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    input_framebuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    input_framebuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    if ((int)uVar11 < 1) {
      uVar11 = 0;
    }
    input_framebuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         input_framebuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (lVar21 = 0; (ulong)uVar11 * 0x38 - lVar21 != 0; lVar21 = lVar21 + 0x38) {
      this_00 = output_headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar21;
      pHVar12 = (Header *)Imf_3_4::MultiPartInputFile::header((int)&infile);
      Imf_3_4::Header::operator=(this_00,pHVar12);
      cVar8 = Imf_3_4::hasMultiView(this_00);
      if (cVar8 != '\0') {
        Imf_3_4::Header::erase((char *)this_00);
      }
      channelstore.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&channelstore.
                     super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      channelstore.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      channelstore.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      _inpart = (pointer)&local_d8;
      local_d8._M_local_buf[0] = '\0';
      parse_filename((string *)&channelstore,(string *)&inpart,&pforce,&pnum);
      cVar8 = Imf_3_4::Header::hasName();
      if ((cVar8 == '\0') || (pforce == true)) {
        Imf_3_4::Header::setName((string *)this_00);
      }
      _outfile = (pointer)0x0;
      alStack_1c0[0] = 0;
      alStack_1c0[1] = 0;
      local_1b0 = alStack_1c0;
      local_1a0 = 0;
      local_1a8 = local_1b0;
      this = (_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
              *)Imf_3_4::Header::channels();
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
      ::operator=(this,(_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
                        *)&outfile);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Channel>_>_>
                   *)&outfile);
      std::__cxx11::string::~string((string *)&inpart);
      std::__cxx11::string::~string((string *)&channelstore);
    }
    make_unique_names(&output_headers);
    Imf_3_4::MultiPartInputFile::header((int)&infile);
    psVar13 = (string *)Imf_3_4::Header::channels();
    p_Var14 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
    __n = 0;
    while( true ) {
      p_Var15 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
      if (p_Var14 == p_Var15) break;
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
      __n = __n + 1;
    }
    Imf_3_4::MultiPartInputFile::header((int)&infile);
    piVar16 = (int *)Imf_3_4::Header::dataWindow();
    iVar10 = *piVar16;
    local_1e4 = piVar16[1];
    iVar1 = piVar16[2];
    local_1e8 = piVar16[3];
    local_1ec = local_1e8 - local_1e4;
    local_a8 = 1;
    if (local_1e4 <= local_1e8 && iVar10 <= iVar1) {
      local_a8 = (long)local_1ec + 1;
    }
    uVar22 = 0;
    if (local_1e4 <= local_1e8 && iVar10 <= iVar1) {
      uVar22 = (long)(iVar1 - iVar10);
    }
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::vector(&channelstore,__n,(allocator_type *)&outfile);
    local_b0 = uVar22 + 1;
    local_a8 = local_a8 * local_b0;
    local_b8 = (long)local_1e4 * ~uVar22 - (long)iVar10;
    lVar21 = 0;
    lVar24 = 0;
    uVar22 = 0;
    local_c0 = psVar13;
    while (uVar22 < (ulong)(((long)input_channels.
                                   super__Vector_base<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)input_channels.
                                  super__Vector_base<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x68)) {
      lVar19 = (long)*(int *)((long)&(output_channels.
                                      super__Vector_base<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->part_number +
                             lVar24);
      lVar17 = Imf_3_4::ChannelList::find(local_c0);
      psVar20 = (string *)
                (output_headers.
                 super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar19 * 0x38);
      local_90 = lVar19;
      psVar13 = (string *)Imf_3_4::Header::channels();
      lVar19 = local_a8;
      pPVar23 = (PixelType *)(lVar17 + 0x120);
      Imf_3_4::ChannelList::insert
                (psVar13,(Channel *)
                         ((long)&((output_channels.
                                   super__Vector_base<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus.
                                 _M_p + lVar24));
      bVar9 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&((output_channels.
                                        super__Vector_base<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->view).
                                      _M_dataplus._M_p + lVar24),"");
      if (bVar9) {
        Imf_3_4::Header::setView(psVar20);
      }
      PVar2 = *pPVar23;
      sVar5 = (PVar2 != HALF) + 1;
      local_a0 = uVar22;
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)
                 ((long)&((channelstore.
                           super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar21),lVar19 << sVar5);
      pFVar7 = output_framebuffers.
               super__Vector_base<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pMVar6 = output_channels.
               super__Vector_base<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_98 = (ulong)(PVar2 != HALF) * 2 + 2;
      lVar19 = local_b8 << sVar5;
      uVar22 = local_b0 << sVar5;
      Imf_3_4::Slice::Slice
                ((Slice *)&outfile,*pPVar23,
                 (char *)(*(long *)((long)&((channelstore.
                                             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                           super__Vector_impl_data._M_start + lVar21) + lVar19),
                 local_98,uVar22,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert
                ((string *)(pFVar7 + local_90),
                 (Slice *)((long)&(pMVar6->name)._M_dataplus._M_p + lVar24));
      pMVar6 = input_channels.
               super__Vector_base<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
               ._M_impl.super__Vector_impl_data._M_start;
      Imf_3_4::Slice::Slice
                ((Slice *)&outfile,*pPVar23,
                 (char *)(lVar19 + *(long *)((long)&((channelstore.
                                                                                                            
                                                  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<char,_std::allocator<char>_>).
                                                  _M_impl.super__Vector_impl_data._M_start + lVar21)
                         ),local_98,uVar22,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert
                ((string *)&input_framebuffer,
                 (Slice *)((long)&(pMVar6->internal_name)._M_dataplus._M_p + lVar24));
      lVar24 = lVar24 + 0x68;
      lVar21 = lVar21 + 0x18;
      uVar22 = local_a0 + 1;
    }
    iVar10 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
              (&outfile,local_c8,
               output_headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (int)(((long)output_headers.
                            super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)output_headers.
                           super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
                           _M_impl.super__Vector_impl_data._M_start) / 0x38),false,iVar10);
    Imf_3_4::InputPart::InputPart(&inpart,&infile,0);
    iVar10 = local_1e4;
    Imf_3_4::InputPart::setFrameBuffer((FrameBuffer *)&inpart);
    Imf_3_4::InputPart::readPixels((int)&inpart,iVar10);
    local_1ec = local_1ec + 1;
    for (uVar22 = 0;
        uVar22 < (ulong)(((long)output_framebuffers.
                                super__Vector_base<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)output_framebuffers.
                               super__Vector_base<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x30);
        uVar22 = uVar22 + 1) {
      Imf_3_4::OutputPart::OutputPart((OutputPart *)&pnum,&outfile,(int)uVar22);
      Imf_3_4::OutputPart::setFrameBuffer((FrameBuffer *)&pnum);
      Imf_3_4::OutputPart::writePixels((int)(OutputPart *)&pnum);
    }
    Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(&outfile);
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::~vector(&channelstore);
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&input_framebuffer);
    std::vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>::~vector
              (&output_framebuffers);
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector(&output_headers);
    std::vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>::
    ~vector(&output_channels);
    std::__cxx11::string::~string((string *)&hero);
    std::vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>::
    ~vector(&input_channels);
    Imf_3_4::MultiPartInputFile::~MultiPartInputFile(&infile);
    return;
  }
  piVar18 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (piVar18,
             "can only convert single part EXRs to multipart EXR-2.0 files: use \'split\' mode instead"
            );
  __cxa_throw(piVar18,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
convert (
    vector<const char*> in,
    vector<const char*> views,
    const char*         outname,
    bool                override)
{
    if (in.size () != 1)
        throw invalid_argument (
            "can only convert one file at once - use 'combine' mode for multiple files");

    MultiPartInputFile infile (in[0]);

    if (infile.parts () != 1)
        throw invalid_argument (
            "can only convert single part EXRs to multipart EXR-2.0 files: use 'split' mode instead");

    vector<MultiViewChannelName> input_channels;

    string hero;
    if (hasMultiView (infile.header (0)))
    {
        StringVector h = multiView (infile.header (0));
        if (h.size () > 0) { hero = h[0]; }
    }

    // retrieve channel names from input file in view-friendly format
    GetChannelsInMultiPartFile (infile, input_channels);

    vector<MultiViewChannelName> output_channels = input_channels;
    // remap channels to multiple output parts
    int parts = SplitChannels (
        output_channels.begin (), output_channels.end (), true, hero);

    vector<Header>      output_headers (parts);
    vector<FrameBuffer> output_framebuffers (parts);
    FrameBuffer         input_framebuffer;

    //
    // make all output headers the same as the input header but
    // with no channels
    //
    for (int i = 0; i < parts; i++)
    {
        Header& h = output_headers[i];
        h         = infile.header (0);
        if (hasMultiView (h)) h.erase ("multiView");

        string fn, pname;
        int    pnum;
        bool   pforce;
        parse_filename (fn, pname, pforce, pnum);
        if (!h.hasName () || pforce) h.setName (pname);

        h.channels () = ChannelList ();
    }

    make_unique_names (output_headers);

    const ChannelList& in_chanlist = infile.header (0).channels ();

    int channel_count = 0;
    for (ChannelList::ConstIterator i = in_chanlist.begin ();
         i != in_chanlist.end ();
         ++i)
    {
        ++channel_count;
    }

    Box2i dataWindow  = infile.header (0).dataWindow ();
    //
    // use int64_t for dimensions, since possible overflow int storage
    //
    int64_t pixel_count = (static_cast<int64_t>(dataWindow.size ().y) + 1) * (static_cast<int64_t>(dataWindow.size ().x) + 1);
    int64_t pixel_width = static_cast<int64_t>(dataWindow.size ().x) + 1;

    //
    // offset in pixels between base of array and 0,0
    // use int64_t for dimensions, since dataWindow.min.y * pixel_width could overflow int storage
    //
    int64_t pixel_base = static_cast<int64_t>(dataWindow.min.y) * pixel_width + static_cast<int64_t>(dataWindow.min.x);

    vector<vector<char>> channelstore (channel_count);

    //
    // insert channels into correct header and framebuffers
    //
    for (size_t i = 0; i < input_channels.size (); i++)
    {
        // read the part we should be writing channel into, insert into header
        int                        part = output_channels[i].part_number;
        ChannelList::ConstIterator chan =
            in_chanlist.find (input_channels[i].internal_name);
        Header& h = output_headers[part];
        h.channels ().insert (output_channels[i].name, chan.channel ());

        if (output_channels[i].view != "")
        {
            h.setView (output_channels[i].view);
        }

        // compute size of channel
        size_t samplesize = sizeof (float);
        if (chan.channel ().type == HALF) { samplesize = sizeof (half); }
        channelstore[i].resize (samplesize * pixel_count);

        output_framebuffers[part].insert (
            output_channels[i].name,
            Slice (
                chan.channel ().type,
                &channelstore[i][0] - pixel_base * samplesize,
                samplesize,
                pixel_width * samplesize));

        input_framebuffer.insert (
            input_channels[i].internal_name,
            Slice (
                chan.channel ().type,
                &channelstore[i][0] - pixel_base * samplesize,
                samplesize,
                pixel_width * samplesize));
    }

    //
    // create output file
    //
    MultiPartOutputFile outfile (
        outname, &output_headers[0], output_headers.size ());

    InputPart inpart (infile, 0);

    //
    // read file
    //
    inpart.setFrameBuffer (input_framebuffer);
    inpart.readPixels (dataWindow.min.y, dataWindow.max.y);

    //
    // write each part
    //

    for (size_t i = 0; i < output_framebuffers.size (); i++)
    {
        OutputPart outpart (outfile, i);
        outpart.setFrameBuffer (output_framebuffers[i]);
        outpart.writePixels (dataWindow.max.y + 1 - dataWindow.min.y);
    }
}